

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reciprocal.c
# Opt level: O1

uint64_t randomx_reciprocal(uint32_t divisor)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = CONCAT44(0,divisor);
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000);
  iVar1 = 0x1f;
  if (divisor != 0) {
    for (; divisor >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  bVar4 = 0x20 - ((byte)iVar1 ^ 0x1f);
  return (ulong)(SUB168(auVar3 % auVar2,0) << (bVar4 & 0x3f)) / CONCAT44(0,divisor) +
         (SUB168(auVar3 / auVar2,0) << (bVar4 & 0x3f));
}

Assistant:

uint64_t randomx_reciprocal(uint32_t divisor) {

	assert(divisor != 0);

	const uint64_t p2exp63 = 1ULL << 63;
	const uint64_t q = p2exp63 / divisor;
	const uint64_t r = p2exp63 % divisor;

#ifdef __GNUC__
	const uint32_t shift = 64 - __builtin_clzll(divisor);
#else
	uint32_t shift = 32;
	for (uint32_t k = 1U << 31; (k & divisor) == 0; k >>= 1)
		--shift;
#endif

	return (q << shift) + ((r << shift) / divisor);
}